

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHeadTrackerDevice.cpp
# Opt level: O1

void __thiscall MinVR::VRFakeHeadTrackerDevice::onVREvent(VRFakeHeadTrackerDevice *this)

{
  VRDataIndex *in_RSI;
  
  onVREvent((VRFakeHeadTrackerDevice *)
            &this[-1]._mouseRotKeys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

void VRFakeHeadTrackerDevice::onVREvent(const VRDataIndex &event)
{
    if (event.getName() == _toggleEvent) {
        _tracking = !_tracking;
    }
    
    if (_tracking) {
        bool sendEvent = false;
        if (std::find(_forwardEvents.begin(), _forwardEvents.end(), event.getName()) != _forwardEvents.end()) {
            VRMatrix4 M = _baseHead * VRMatrix4::rotationY(-_yaw);
            VRVector3 dir = M * VRVector3(0,0,-1);
            dir = dir.normalize();
            _baseHead = _baseHead * VRMatrix4::translation(0.075f * _tScale * dir);
            sendEvent = true;
        }
        else if (std::find(_backEvents.begin(), _backEvents.end(), event.getName()) != _backEvents.end()) {
            VRMatrix4 M = _baseHead * VRMatrix4::rotationY(-_yaw);
            VRVector3 dir = M * VRVector3(0,0,1);
            dir = dir.normalize();
            _baseHead = _baseHead * VRMatrix4::translation(0.075f * _tScale * dir);
            sendEvent = true;
        }
        else if (std::find(_leftEvents.begin(), _leftEvents.end(), event.getName()) != _leftEvents.end()) {
            _baseHead = _baseHead *  VRMatrix4::rotationY(0.025f * _rScale);
            sendEvent = true;
        }
        else if (std::find(_rightEvents.begin(), _rightEvents.end(), event.getName()) != _rightEvents.end()) {
            _baseHead = _baseHead * VRMatrix4::rotationY(-0.025f * _rScale);
            sendEvent = true;
        }
        else if (myEventMatch(event.getName(), _mouseRotKeys, "Down")) {
            _mouseRotating = true;
        }
        else if (myEventMatch(event.getName(), _mouseRotKeys, "Up")) {
            _mouseRotating = false;
        }
        else if (event.getName() == "Mouse_Move") {
            VRFloatArray screenPos = event.getValue("NormalizedPosition");
            if (screenPos.size() >= 2) {
                float mousex = 2.0f*(screenPos[0] - 0.5f);
                float mousey = 2.0f*((1.0f-screenPos[1]) - 0.5f);
                
                if (_mouseRotating) {
                    float deltaX = mousex - _lastMouseX;
                    float deltaY = mousey - _lastMouseY;
                    
                    _yaw += deltaX;
                    _pitch += deltaY;
                                        
                    _addedRot = VRMatrix4::rotationY(-_yaw) * VRMatrix4::rotationX(_pitch);
                    sendEvent = true;
                }
                
                _lastMouseX = mousex;
                _lastMouseY = mousey;
            }
        }
        
        if (sendEvent) {
            VRMatrix4 M = _baseHead * _addedRot;
            VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, M.toVRFloatArray());
            _pendingEvents.push(di);
        }
    }
}